

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_dns.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  double dVar2;
  uint uVar3;
  undefined8 *userdata;
  N_Vector yy;
  N_Vector yd;
  N_Vector p_Var4;
  long *plVar5;
  long lVar6;
  char *pcVar7;
  N_Vector y;
  int iVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar9;
  undefined4 uVar10;
  SUNContext ctx;
  sunrealtype time;
  undefined8 local_68;
  sunrealtype local_60;
  long local_58;
  long *local_50;
  long local_48;
  double local_40;
  N_Vector local_38;
  
  uVar3 = SUNContext_Create(0,&local_68);
  if ((int)uVar3 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    userdata = (undefined8 *)malloc(0x48);
    *userdata = 0x4032b33333333333;
    userdata[1] = 0x3fe28f5c28f5c28f;
    userdata[2] = 0x3fb70a3d70a3d70a;
    userdata[3] = 0x3fdae147ae147ae1;
    userdata[4] = 0x4041333333333333;
    userdata[5] = 0x400a666666666666;
    *(undefined4 *)(userdata + 6) = 0xb851eb85;
    *(undefined4 *)((long)userdata + 0x34) = 0x405cf51e;
    *(undefined4 *)(userdata + 7) = 0xcccccccd;
    *(undefined4 *)((long)userdata + 0x3c) = 0x3feccccc;
    userdata[8] = 0x4087080000000000;
    yy = (N_Vector)N_VNew_Serial(6,local_68);
    if (yy == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    yd = (N_Vector)N_VClone(yy);
    if (yd == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)yy->content + 0x10);
    *puVar1 = 0x3fdc6a7ef9db22d1;
    puVar1[1] = 0x3f5426fe718a86d7;
    *(undefined4 *)(puVar1 + 2) = 0;
    *(undefined4 *)((long)puVar1 + 0x14) = 0;
    *(undefined4 *)(puVar1 + 3) = 0x3126e979;
    *(undefined4 *)((long)puVar1 + 0x1c) = 0x3f7cac08;
    *(undefined4 *)(puVar1 + 4) = 0;
    *(undefined4 *)((long)puVar1 + 0x24) = 0;
    *(undefined4 *)(puVar1 + 5) = 0xee17cb23;
    *(undefined4 *)((long)puVar1 + 0x2c) = 0x3fd70a3b;
    N_VConst(0,yd);
    p_Var4 = (N_Vector)N_VClone(yy);
    res((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),yy,yd,p_Var4,userdata);
    N_VScale(0,p_Var4,yd);
    N_VDestroy(p_Var4);
    plVar5 = (long *)N_VNew_Serial(1,local_68);
    if (plVar5 == (long *)0x0) {
      main_cold_4();
      return 1;
    }
    **(undefined8 **)(*plVar5 + 0x10) = 0;
    p_Var4 = (N_Vector)IDACreate(local_68);
    local_38 = p_Var4;
    if (p_Var4 == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    uVar3 = IDAInit(0,p_Var4,res,yy,yd);
    if ((int)uVar3 < 0) {
      pcVar7 = "IDAInit";
    }
    else {
      uVar3 = IDASStolerances(0xe2308c3a,0xd9d7bdbb,p_Var4);
      if ((int)uVar3 < 0) {
        pcVar7 = "IDASStolerances";
      }
      else {
        uVar3 = IDASetUserData(p_Var4,userdata);
        if ((int)uVar3 < 0) {
          pcVar7 = "IDASetUserData";
        }
        else {
          lVar6 = SUNDenseMatrix(6,6,local_68);
          if (lVar6 == 0) {
            main_cold_2();
            return 1;
          }
          local_48 = SUNLinSol_Dense(yy,lVar6,local_68);
          if (local_48 == 0) {
            main_cold_1();
            return 1;
          }
          uVar3 = IDASetLinearSolver(p_Var4,local_48,lVar6);
          if ((int)uVar3 < 0) {
            pcVar7 = "IDASetLinearSolver";
          }
          else {
            uVar3 = IDAQuadInit(p_Var4,rhsQ,plVar5);
            if ((int)uVar3 < 0) {
              pcVar7 = "IDAQuadInit";
            }
            else {
              uVar9 = 0x812dea11;
              uVar10 = 0x3d719799;
              uVar3 = IDAQuadSStolerances(0xd9d7bdbb,p_Var4);
              if ((int)uVar3 < 0) {
                pcVar7 = "IDAQuadSStolerances";
              }
              else {
                y = p_Var4;
                local_58 = lVar6;
                uVar3 = IDASetQuadErrCon(p_Var4,1);
                if ((int)uVar3 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                          "IDASetQuadErrCon",(ulong)uVar3);
                  return 1;
                }
                local_50 = plVar5;
                PrintHeader((sunrealtype)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
                            (sunrealtype)CONCAT44(uVar10,uVar9),y);
                PrintOutput(p_Var4,0.0,yy);
                iVar8 = 0x1a;
                dVar2 = 1e-08;
                do {
                  local_40 = dVar2;
                  uVar3 = IDASolve(p_Var4,&local_60,yy,yd,1);
                  if ((int)uVar3 < 0) {
                    pcVar7 = "IDASolve";
                    goto LAB_00102956;
                  }
                  PrintOutput(p_Var4,local_60,yy);
                  plVar5 = local_50;
                  dVar2 = local_40 * 2.57164431035691;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
                uVar3 = IDAGetQuad(p_Var4,&local_60,local_50);
                if ((int)uVar3 < 0) {
                  pcVar7 = "IDAGetQuad";
                }
                else {
                  puts("\n--------------------------------------------------------");
                  printf("G:          %24.16f \n",(int)**(undefined8 **)(*plVar5 + 0x10));
                  puts("--------------------------------------------------------\n");
                  uVar3 = PrintFinalStats(p_Var4);
                  if (-1 < (int)uVar3) {
                    IDAFree(&local_38);
                    SUNLinSolFree(local_48);
                    SUNMatDestroy(local_58);
                    N_VDestroy(yy);
                    N_VDestroy(yd);
                    N_VDestroy(plVar5);
                    free(userdata);
                    SUNContext_Free(&local_68);
                    return 0;
                  }
                  pcVar7 = "PrintFinalStats";
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00102956:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar7,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  UserData data;
  void* mem;
  N_Vector yy, yp, rr, q;
  int retval;
  sunrealtype time, tout, incr;
  int nout;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  /* Consistent IC for  y, y'. */
  const sunrealtype y01 = SUN_RCONST(0.444);
  const sunrealtype y02 = SUN_RCONST(0.00123);
  const sunrealtype y03 = SUN_RCONST(0.0);
  const sunrealtype y04 = SUN_RCONST(0.007);
  const sunrealtype y05 = SUN_RCONST(0.0);

  mem = NULL;
  yy = yp = NULL;
  A       = NULL;
  LS      = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate user data. */
  data = (UserData)malloc(sizeof(*data));

  /* Fill user's data with the appropriate values for coefficients. */
  data->k1   = SUN_RCONST(18.7);
  data->k2   = SUN_RCONST(0.58);
  data->k3   = SUN_RCONST(0.09);
  data->k4   = SUN_RCONST(0.42);
  data->K    = SUN_RCONST(34.4);
  data->klA  = SUN_RCONST(3.3);
  data->Ks   = SUN_RCONST(115.83);
  data->pCO2 = SUN_RCONST(0.9);
  data->H    = SUN_RCONST(737.0);

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* Set IC */
  Ith(yy, 1) = y01;
  Ith(yy, 2) = y02;
  Ith(yy, 3) = y03;
  Ith(yy, 4) = y04;
  Ith(yy, 5) = y05;
  Ith(yy, 6) = data->Ks * y01 * y04;

  /* Get y' = - res(t0, y, 0) */
  N_VConst(ZERO, yp);

  rr = N_VClone(yy);
  res(T0, yy, yp, rr, data);
  N_VScale(-ONE, rr, yp);
  N_VDestroy(rr);

  /* Create and initialize q0 for quadratures. */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set tolerances. */
  retval = IDASStolerances(mem, RTOL, ATOL);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Attach user data. */
  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Initialize QUADRATURE(S). */
  retval = IDAQuadInit(mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  /* Set tolerances and error control for quadratures. */
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  PrintHeader(RTOL, ATOL, yy);
  /* Print initial states */
  PrintOutput(mem, 0.0, yy);

  tout = T1;
  nout = 0;
  incr = SUNRpowerR(TF / T1, ONE / NF);

  /* FORWARD run. */
  while (1)
  {
    retval = IDASolve(mem, tout, &time, yy, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    PrintOutput(mem, time, yy);

    nout++;
    tout *= incr;

    if (nout > NF) { break; }
  }

  retval = IDAGetQuad(mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

  printf("\n--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %24.16Lf \n", Ith(q, 1));
#else
  printf("G:          %24.16f \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}